

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O0

bool vera::loadOBJ(string *_filename,Mesh *_mesh)

{
  undefined8 uVar1;
  pointer pfVar2;
  bool bVar3;
  char *pcVar4;
  char *mtl_basedir;
  ulong uVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  mapped_type *_normal;
  vec3 vVar11;
  vec4 vVar12;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_2f8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_2f4;
  vec2 local_288;
  _Self local_280;
  _Self local_278;
  vec3 local_270;
  vec3 local_260;
  vec4 local_250;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_240;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_23c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_238;
  vec3 local_230;
  int local_224;
  int local_220;
  int ti;
  int ni;
  int vi;
  index_t index;
  size_t i;
  uint32_t iCounter;
  int mi;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  string local_1a8 [8];
  string name;
  size_t s;
  bool ret;
  allocator local_161;
  string local_160;
  undefined1 local_140 [8];
  string base_dir;
  string err;
  string warn;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t attrib;
  Mesh *_mesh_local;
  string *_filename_local;
  
  attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)_mesh;
  tinyobj::attrib_t::attrib_t
            ((attrib_t *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
             &materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::vector
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             ((long)&warn.field_2 + 8));
  std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(base_dir.field_2._M_local_buf + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,pcVar4,&local_161);
  getBaseDir((string *)local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  mtl_basedir = (char *)std::__cxx11::string::c_str();
  bVar3 = tinyobj::LoadObj((attrib_t *)
                           &shapes.
                            super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                           ((long)&warn.field_2 + 8),(string *)((long)&err.field_2 + 8),
                           (string *)((long)&base_dir.field_2 + 8),pcVar4,mtl_basedir,true,true);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"WARN: ");
    poVar6 = std::operator<<(poVar6,(string *)(err.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(base_dir.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  if (bVar3) {
    for (name.field_2._8_8_ = 0; uVar1 = name.field_2._8_8_,
        sVar7 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::size
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (ulong)uVar1 < sVar7; name.field_2._8_8_ = name.field_2._8_8_ + 1) {
      pvVar8 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                         ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                          &materials.
                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
      std::__cxx11::string::string(local_1a8,(string *)pvVar8);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        toString<unsigned_long>
                  ((string *)&smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (unsigned_long *)(name.field_2._M_local_buf + 8));
        std::__cxx11::string::operator=
                  (local_1a8,
                   (string *)&smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string
                  ((string *)&smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      std::
      map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::map((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
             *)&iCounter);
      pvVar8 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                         ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                          &materials.
                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
      bVar3 = hasSmoothingGroup(pvVar8);
      if (bVar3) {
        pvVar8 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                           ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                            &materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
        computeSmoothingNormals
                  ((attrib_t *)
                   &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8,
                   (map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                    *)&iCounter);
      }
      i._0_4_ = 0;
      stack0xfffffffffffffdf8 = 0;
      while( true ) {
        uVar5 = stack0xfffffffffffffdf8;
        pvVar8 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                           ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                            &materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
        sVar7 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                          (&(pvVar8->mesh).indices);
        if (sVar7 <= uVar5) break;
        pvVar8 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                           ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                            &materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
        pvVar9 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                           (&(pvVar8->mesh).indices,stack0xfffffffffffffdf8);
        pfVar2 = attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_224 = pvVar9->texcoord_index;
        ni = pvVar9->vertex_index;
        unique0x00012004 = pvVar9->normal_index;
        ti = ni;
        local_220 = unique0x00012004;
        index.vertex_index = local_224;
        vVar11 = getVertex((attrib_t *)
                           &shapes.
                            super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,ni);
        local_238 = vVar11.field_2;
        local_230._0_8_ = vVar11._0_8_;
        local_2f8 = vVar11.field_0;
        aStack_2f4 = vVar11.field_1;
        local_240 = local_2f8;
        aStack_23c = aStack_2f4;
        local_230.field_2 = local_238;
        Mesh::addVertex((Mesh *)pfVar2,&local_230);
        sVar7 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pfVar2 = attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (sVar7 != 0) {
          vVar12 = getColor((attrib_t *)
                            &shapes.
                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,ti);
          local_250._8_8_ = vVar12._8_8_;
          local_250._0_8_ = vVar12._0_8_;
          Mesh::addColor((Mesh *)pfVar2,&local_250);
        }
        sVar7 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pfVar2 = attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (sVar7 == 0) {
          sVar10 = std::
                   map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::size((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                           *)&iCounter);
          if (sVar10 != 0) {
            local_278._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                 ::find((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                         *)&iCounter,&ti);
            local_280._M_node =
                 (_Base_ptr)
                 std::
                 map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                 ::end((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                        *)&iCounter);
            bVar3 = std::operator!=(&local_278,&local_280);
            pfVar2 = attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (bVar3) {
              _normal = std::
                        map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                        ::at((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                              *)&iCounter,&ti);
              Mesh::addNormal((Mesh *)pfVar2,_normal);
            }
          }
        }
        else {
          vVar11 = getNormal((attrib_t *)
                             &shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_220);
          local_270.field_2 = vVar11.field_2;
          local_270._0_8_ = vVar11._0_8_;
          local_260._0_8_ = local_270._0_8_;
          local_260.field_2 = local_270.field_2;
          Mesh::addNormal((Mesh *)pfVar2,&local_260);
        }
        sVar7 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage);
        pfVar2 = attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (sVar7 != 0) {
          local_288 = getTexCoords((attrib_t *)
                                   &shapes.
                                    super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_224);
          Mesh::addTexCoord((Mesh *)pfVar2,&local_288);
        }
        Mesh::addIndex((Mesh *)attrib.colors.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t)i);
        register0x00000000 = stack0xfffffffffffffdf8 + 1;
        i._0_4_ = (uint32_t)i + 1;
      }
      std::
      map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::~map((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)&iCounter);
      std::__cxx11::string::~string(local_1a8);
    }
    _filename_local._7_1_ = true;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to load ");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar6 = std::operator<<(poVar6,pcVar4);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    _filename_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)(base_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             ((long)&warn.field_2 + 8));
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
             &materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tinyobj::attrib_t::~attrib_t
            ((attrib_t *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return _filename_local._7_1_;
}

Assistant:

bool loadOBJ( const std::string& _filename, Mesh& _mesh ) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) std::cout << "WARN: " << warn << std::endl;
    if (!err.empty()) std::cerr << err << std::endl;
    
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0)
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);

        // std::map<INDEX_TYPE, tinyobj::index_t> unique_indices;
        // std::map<INDEX_TYPE, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // // Associate w material with face
            // int f = (int)floor(i/3);
            // if (shapes[s].mesh.material_ids.size() > 0) {
            //     int material_index = shapes[s].mesh.material_ids[f];

            //     // but only when change
            //     if (mi != material_index) {
            //         mi = material_index;
            //         _mesh.addMaterial( InitMaterial( materials[mi] ) );
            //     }
            // }

            // bool reuse = false;
            // iter = unique_indices.find(vi);

            // // if already exist 
            // if (iter != unique_indices.end())
            //     // and have the same attributes
            //     if ((iter->second.normal_index == ni) &&
            //         (iter->second.texcoord_index == ti) )
            //         reuse = true;

            // Re use the vertex
            // if (reuse)
            //     _mesh.addFaceIndex( (INDEX_TYPE)iter->second.vertex_index );

            // // Other wise create a new one
            // else 
            {
                // unique_indices[vi].vertex_index = iCounter;
                // unique_indices[vi].normal_index = ni;
                // unique_indices[vi].texcoord_index = ti;
                
                _mesh.addVertex( getVertex(attrib, vi) );

                if (attrib.colors.size() > 0)
                    _mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    _mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        _mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    _mesh.addTexCoord( getTexCoords(attrib, ti) );

                // _mesh.addFaceIndex( iCounter );
                // iCounter++;
                _mesh.addIndex(iCounter++);
            }
        }
    }

    return true;
}